

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O1

void __thiscall helics::zeromq::ZmqComms::queue_tx_function(ZmqComms *this)

{
  string *networkInterface;
  unique_ptr<zmq::context_t,_std::default_delete<zmq::context_t>_> *puVar1;
  socket_base sVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  error_t *this_00;
  socklen_t sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Base_ptr p_Var11;
  byte *pbVar12;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  ActionMessage *command;
  ConnectionStatus status;
  context_t *context_;
  undefined8 uVar13;
  const_iterator cVar14;
  undefined1 auVar15 [8];
  ulong uVar16;
  undefined1 *puVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  socket_t *psVar19;
  int __flags;
  void *in_R8;
  void *pvVar20;
  socklen_t in_R9D;
  string_view message;
  string_view message_00;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
  pVar21;
  socket_t zsock;
  socket_t brokerPushSocket;
  socket_t controlSocket;
  vector<char,_std::allocator<char>_> buffer;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  interfaceAndPort;
  shared_ptr<ZmqContextManager> ctx;
  string controlsockString;
  map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
  routes;
  message_t msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  string local_300;
  socket_t local_2e0;
  uint local_2cc;
  socket_t local_2c8;
  vector<char,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [8];
  undefined1 local_290 [24];
  int local_278;
  ZmqContextManager local_1d8 [2];
  undefined1 local_168 [8];
  undefined1 local_160 [24];
  _Base_ptr local_148;
  size_t local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [2];
  undefined1 local_e8 [32];
  Time TStack_c8;
  Time local_c0;
  Time TStack_b8;
  Time local_b0;
  byte abStack_a8 [64];
  void *pvStack_68;
  size_t local_60;
  byte *local_58;
  undefined8 local_50;
  pointer pbStack_48;
  pointer local_40;
  pointer pbStack_38;
  
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  local_290._0_8_ = 0;
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_298 = (undefined1  [8])(local_290 + 8);
  ZmqContextManager::getContextPointer(local_1d8,(string *)local_298);
  if (local_298 != (undefined1  [8])(local_290 + 8)) {
    operator_delete((void *)local_298,local_290._8_8_ + 1);
  }
  zmq::socket_t::socket_t(&local_2c8,*(context_t **)(local_1d8[0].name._M_dataplus._M_p + 0x20),0);
  local_298._0_4_ = 200;
  zmq::detail::socket_base::setsockopt
            (&local_2c8.super_socket_base,0x11,(int)local_298,4,in_R8,in_R9D);
  local_168 = (undefined1  [8])(local_160 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"inproc://","");
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     (this->super_NetworkCommsInterface).super_CommsInterface.name._M_dataplus._M_p,
                     (this->super_NetworkCommsInterface).super_CommsInterface.name._M_string_length)
  ;
  local_128[0]._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128[0]._M_dataplus._M_p == paVar10) {
    local_128[0].field_2._0_8_ = paVar10->_M_allocated_capacity;
    local_128[0].field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_128[0]._M_dataplus._M_p = (pointer)&local_128[0].field_2;
  }
  else {
    local_128[0].field_2._0_8_ = paVar10->_M_allocated_capacity;
  }
  local_128[0]._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pvVar20 = (void *)0x5f;
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(local_128,local_128[0]._M_string_length,0,1,'_');
  local_e8._0_8_ = (pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._0_8_ == paVar10) {
    local_e8._16_8_ = paVar10->_M_allocated_capacity;
    local_e8._24_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_e8._0_8_ = local_e8 + 0x10;
  }
  else {
    local_e8._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_e8._8_8_ = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     (this->super_NetworkCommsInterface).super_CommsInterface.randomID._M_dataplus.
                     _M_p,(this->super_NetworkCommsInterface).super_CommsInterface.randomID.
                          _M_string_length);
  local_298 = (undefined1  [8])(local_290 + 8);
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if (paVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)paVar10) {
    local_290._8_8_ = paVar10->_M_allocated_capacity;
    local_290._16_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_290._8_8_ = paVar10->_M_allocated_capacity;
    local_298 = (undefined1  [8])paVar18;
  }
  local_290._0_8_ = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                  "_control");
  local_1d8[0].name.field_2._0_8_ = &local_1d8[0].zcontext;
  puVar1 = (unique_ptr<zmq::context_t,_std::default_delete<zmq::context_t>_> *)
           (pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 == paVar10) {
    local_1d8[0].zcontext._M_t.
    super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
    super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
    super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl =
         (__uniq_ptr_data<zmq::context_t,_std::default_delete<zmq::context_t>,_true,_true>)
         paVar10->_M_allocated_capacity;
    local_1d8[0]._40_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_1d8[0].zcontext._M_t.
    super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
    super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
    super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl =
         (__uniq_ptr_data<zmq::context_t,_std::default_delete<zmq::context_t>,_true,_true>)
         paVar10->_M_allocated_capacity;
    local_1d8[0].name.field_2._0_8_ = puVar1;
  }
  __addr = (sockaddr *)pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  local_1d8[0].name.field_2._8_8_ = __addr;
  if (local_298 != (undefined1  [8])(local_290 + 8)) {
    operator_delete((void *)local_298,local_290._8_8_ + 1);
    __addr = extraout_RDX;
  }
  sVar9 = (socklen_t)paVar10;
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    __addr = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128[0]._M_dataplus._M_p != &local_128[0].field_2) {
    operator_delete(local_128[0]._M_dataplus._M_p,local_128[0].field_2._M_allocated_capacity + 1);
    __addr = extraout_RDX_01;
  }
  if (local_168 != (undefined1  [8])(local_160 + 8)) {
    operator_delete((void *)local_168,(ulong)(local_160._8_8_ + 1));
    __addr = extraout_RDX_02;
  }
  zmq::detail::socket_base::connect
            (&local_2c8.super_socket_base,(int)local_1d8[0].name.field_2._M_allocated_capacity,
             __addr,sVar9);
  iVar5 = initializeBrokerConnections(this,&local_2c8);
  if (iVar5 < 0) {
    status = (uint)(iVar5 != -3) * 2 + TERMINATED;
    CommsInterface::setTxStatus((CommsInterface *)this,status);
    psVar19 = &local_2c8;
  }
  else {
    zmq::socket_t::socket_t(&local_2e0,*(context_t **)(local_1d8[0].name._M_dataplus._M_p + 0x20),8)
    ;
    local_298._0_4_ = 200;
    zmq::detail::socket_base::setsockopt
              (&local_2e0.super_socket_base,0x11,(int)local_298,4,pvVar20,in_R9D);
    networkInterface = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress
    ;
    p_Var11 = (_Base_ptr)(local_168 + 8);
    local_160._0_4_ = _S_red;
    local_160._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_140 = 0;
    local_160._16_8_ = p_Var11;
    local_148 = p_Var11;
    if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
      gmlc::networking::makePortAddress
                ((string *)local_298,networkInterface,(this->super_NetworkCommsInterface).brokerPort
                );
      zmq::detail::socket_base::connect
                (&local_2e0.super_socket_base,local_298._0_4_,__addr_00,(socklen_t)p_Var11);
      if (local_298 != (undefined1  [8])(local_290 + 8)) {
        operator_delete((void *)local_298,local_290._8_8_ + 1);
      }
    }
    cVar14._M_node = (_Base_ptr)0x0;
    CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
    local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                networkInterface;
    zmq_msg_init(local_128);
    local_130 = &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue;
    local_2cc = (uint)CONCAT71((int7)((ulong)local_130 >> 8),1);
    do {
      iVar5 = (int)cVar14._M_node;
      if ((local_2cc & 1) == 0) break;
      local_e8._0_8_ = (pointer)0x0;
      local_e8._8_8_ = 0x9aac0f0000000000;
      local_e8._16_8_ = 0x9aac0f0000000000;
      abStack_a8[0x38] = 0;
      abStack_a8[0x39] = 0;
      abStack_a8[0x3a] = 0;
      abStack_a8[0x3b] = 0;
      abStack_a8[0x3c] = 0;
      abStack_a8[0x3d] = 0;
      abStack_a8[0x3e] = 0;
      abStack_a8[0x3f] = 0;
      pvStack_68 = (void *)0x0;
      abStack_a8[0x28] = 0;
      abStack_a8[0x29] = 0;
      abStack_a8[0x2a] = 0;
      abStack_a8[0x2b] = 0;
      abStack_a8[0x2c] = 0;
      abStack_a8[0x2d] = 0;
      abStack_a8[0x2e] = 0;
      abStack_a8[0x2f] = 0;
      abStack_a8[0x30] = 0;
      abStack_a8[0x31] = 0;
      abStack_a8[0x32] = 0;
      abStack_a8[0x33] = 0;
      abStack_a8[0x34] = 0;
      abStack_a8[0x35] = 0;
      abStack_a8[0x36] = 0;
      abStack_a8[0x37] = 0;
      abStack_a8[0x18] = 0;
      abStack_a8[0x19] = 0;
      abStack_a8[0x1a] = 0;
      abStack_a8[0x1b] = 0;
      abStack_a8[0x1c] = 0;
      abStack_a8[0x1d] = 0;
      abStack_a8[0x1e] = 0;
      abStack_a8[0x1f] = 0;
      abStack_a8[0x20] = 0;
      abStack_a8[0x21] = 0;
      abStack_a8[0x22] = 0;
      abStack_a8[0x23] = 0;
      abStack_a8[0x24] = 0;
      abStack_a8[0x25] = 0;
      abStack_a8[0x26] = 0;
      abStack_a8[0x27] = 0;
      abStack_a8[8] = 0;
      abStack_a8[9] = 0;
      abStack_a8[10] = 0;
      abStack_a8[0xb] = 0;
      abStack_a8[0xc] = 0;
      abStack_a8[0xd] = 0;
      abStack_a8[0xe] = 0;
      abStack_a8[0xf] = 0;
      abStack_a8[0x10] = 0;
      abStack_a8[0x11] = 0;
      abStack_a8[0x12] = 0;
      abStack_a8[0x13] = 0;
      abStack_a8[0x14] = 0;
      abStack_a8[0x15] = 0;
      abStack_a8[0x16] = 0;
      abStack_a8[0x17] = 0;
      local_b0.internalTimeCode = 0;
      abStack_a8[0] = 0;
      abStack_a8[1] = 0;
      abStack_a8[2] = 0;
      abStack_a8[3] = 0;
      abStack_a8[4] = 0;
      abStack_a8[5] = 0;
      abStack_a8[6] = 0;
      abStack_a8[7] = 0;
      local_c0.internalTimeCode = 0;
      TStack_b8.internalTimeCode = 0;
      local_e8._24_8_ = 0;
      TStack_c8.internalTimeCode = 0;
      local_60 = 0x40;
      local_58 = abStack_a8;
      local_40 = (pointer)0x0;
      pbStack_38 = (pointer)0x0;
      local_50._0_1_ = false;
      local_50._1_1_ = false;
      local_50._2_1_ = false;
      local_50._3_1_ = '\0';
      local_50._4_4_ = 0;
      pbStack_48 = (pointer)0x0;
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::pop((pair<helics::route_id,_helics::ActionMessage> *)local_298,local_130);
      uVar3 = local_298._0_4_;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_298 + 8);
      cVar14._M_node = (_Base_ptr)paVar18;
      ActionMessage::operator=((ActionMessage *)local_e8,(ActionMessage *)paVar18);
      ActionMessage::~ActionMessage((ActionMessage *)paVar18);
      if ((((local_e8._0_4_ == cmd_protocol_priority) || (local_e8._0_4_ == cmd_protocol_big)) ||
          (local_e8._0_4_ == cmd_protocol)) && (uVar3 == 0xffffffff)) {
        bVar4 = false;
        if ((int)local_e8._4_4_ < 0x14d) {
          if (local_e8._4_4_ == 0xe9) {
            local_320._M_allocated_capacity = (size_type)&local_310;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_320,local_58,(byte *)((long)pvStack_68 + (long)local_58));
            gmlc::networking::extractInterfaceAndPort
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                        *)local_298,(string *)&local_320);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_allocated_capacity != &local_310) {
              operator_delete((void *)local_320._M_allocated_capacity,
                              local_310._M_allocated_capacity + 1);
            }
            zmq::socket_t::socket_t
                      ((socket_t *)&local_300,
                       *(context_t **)(local_1d8[0].name._M_dataplus._M_p + 0x20),8);
            local_320._M_allocated_capacity._0_4_ = 100;
            sVar9 = 4;
            zmq::detail::socket_base::setsockopt
                      ((socket_base *)&local_300,0x11,(int)&local_320,4,pvVar20,in_R9D);
            gmlc::networking::makePortAddress((string *)&local_320,(string *)local_298,local_278);
            zmq::detail::socket_base::connect
                      ((socket_base *)&local_300,(int)local_320._M_allocated_capacity,__addr_02,
                       sVar9);
            cVar14._M_node = (_Base_ptr)&local_320;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_allocated_capacity != &local_310) {
              operator_delete((void *)local_320._M_allocated_capacity,
                              local_310._M_allocated_capacity + 1);
            }
            local_320._M_allocated_capacity._0_4_ = local_e8._20_4_;
            std::
            _Rb_tree<helics::route_id,std::pair<helics::route_id_const,zmq::socket_t>,std::_Select1st<std::pair<helics::route_id_const,zmq::socket_t>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,zmq::socket_t>>>
            ::_M_emplace_unique<helics::route_id,zmq::socket_t>
                      ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,zmq::socket_t>,std::_Select1st<std::pair<helics::route_id_const,zmq::socket_t>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,zmq::socket_t>>>
                        *)local_168,(route_id *)cVar14._M_node,(socket_t *)&local_300);
            zmq::socket_t::close((socket_t *)&local_300,(int)cVar14._M_node);
            if (local_298 != (undefined1  [8])(local_290 + 8)) {
              cVar14._M_node = (_Base_ptr)(local_290._8_8_ + 1);
              operator_delete((void *)local_298,(ulong)cVar14._M_node);
            }
          }
          else {
            if (local_e8._4_4_ != 0xf4) goto LAB_002d6364;
            local_298._0_4_ = local_e8._20_4_;
            pVar21 = std::
                     _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                     ::equal_range((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                                    *)local_168,(key_type *)local_298);
            cVar14._M_node = (_Base_ptr)pVar21.first._M_node;
            std::
            _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
            ::_M_erase_aux((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                            *)local_168,cVar14,(_Base_ptr)pVar21.second._M_node);
          }
          bVar4 = true;
        }
        else {
          if (local_e8._4_4_ == 0x14d) {
            zmq::socket_t::close(&local_2e0,(int)cVar14._M_node);
            context_ = *(context_t **)(local_1d8[0].name._M_dataplus._M_p + 0x20);
            zmq::socket_t::socket_t((socket_t *)local_298,context_,8);
            sVar2._handle = local_2e0.super_socket_base._handle;
            local_2e0.super_socket_base._handle = (void *)local_298;
            local_298 = (undefined1  [8])sVar2._handle;
            zmq::socket_t::close((socket_t *)local_298,(int)context_);
            local_298._0_4_ = 200;
            zmq::detail::socket_base::setsockopt
                      (&local_2e0.super_socket_base,0x11,(int)(string *)local_298,4,pvVar20,in_R9D);
            pbVar7 = local_138;
            pbVar12 = local_58;
            pvVar20 = pvStack_68;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(local_138,0,
                       (this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress.
                       _M_string_length,(char *)local_58,(size_type)pvStack_68);
            sVar9 = (socklen_t)pbVar12;
            (this->super_NetworkCommsInterface).brokerPort = local_e8._20_4_;
            gmlc::networking::makePortAddress((string *)local_298,(string *)pbVar7,local_e8._20_4_);
            cVar14._M_node = (_Base_ptr)local_298;
            zmq::detail::socket_base::connect
                      (&local_2e0.super_socket_base,local_298._0_4_,__addr_01,sVar9);
            if (local_298 != (undefined1  [8])(local_290 + 8)) {
              cVar14._M_node = (_Base_ptr)(local_290._8_8_ + 1);
              operator_delete((void *)local_298,(ulong)cVar14._M_node);
            }
            goto LAB_002d6362;
          }
          if (local_e8._4_4_ == 0x7cd) {
            bVar4 = false;
            cVar14._M_node = (_Base_ptr)0x0;
            CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
          }
          else {
            bVar4 = false;
            if (local_e8._4_4_ == 0x9db) {
              bVar4 = true;
              local_2cc = 0;
            }
          }
        }
      }
      else {
LAB_002d6362:
        bVar4 = false;
      }
LAB_002d6364:
      iVar6 = 2;
      if (!bVar4) {
        if (((uVar3 & 0xff000000) == 0xa000000) ||
           ((this->super_NetworkCommsInterface).super_CommsInterface.useJsonSerialization == true))
        {
          ActionMessage::to_json_string_abi_cxx11_((string *)local_298,(ActionMessage *)local_e8);
          std::vector<char,_std::allocator<char>_>::resize(&local_2b8,local_290._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            memmove(local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,(void *)local_298,local_290._0_8_);
          }
          if (local_298 != (undefined1  [8])(local_290 + 8)) {
            operator_delete((void *)local_298,local_290._8_8_ + 1);
          }
        }
        else {
          ActionMessage::to_vector((ActionMessage *)local_e8,&local_2b8);
        }
        __flags = (int)pvVar20;
        iVar5 = (int)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        cVar14._M_node =
             (_Base_ptr)
             local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        if (uVar3 == 0xffffffff) {
          zmq::detail::socket_base::send
                    (&local_2c8.super_socket_base,iVar5,
                     local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish +
                     -(long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,1,__flags);
          iVar6 = 2;
        }
        else if (uVar3 == 0) {
          if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
            iVar6 = 0;
            message._M_str = "no route to broker for message";
            message._M_len = 0x1e;
            cVar14._M_node = (_Base_ptr)0x1e;
            CommsInterface::logWarning((CommsInterface *)this,message);
          }
          else {
            iVar6 = 0;
            zmq::detail::socket_base::send
                      (&local_2e0.super_socket_base,iVar5,
                       local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                       -(long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,0,__flags);
          }
        }
        else {
          cVar14._M_node = (_Base_ptr)(local_168 + 8);
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)cVar14._M_node;
          for (paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_160._8_8_;
              paVar18 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0; paVar18 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  **)((long)paVar18 + (ulong)(iVar6 < (int)uVar3) * 8 + 0x10)) {
            iVar6 = (int)((Time *)(paVar18->_M_local_buf + 0x20))->internalTimeCode;
            if ((int)uVar3 <= iVar6) {
              paVar8 = paVar18;
            }
          }
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)cVar14._M_node;
          if ((paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)cVar14._M_node) &&
             (paVar18 = paVar8,
             (int)uVar3 < (int)((Time *)(paVar8->_M_local_buf + 0x20))->internalTimeCode)) {
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)cVar14._M_node;
          }
          if (paVar18 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cVar14._M_node) {
            psVar19 = &local_2e0;
            if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
              bVar4 = isIgnoreableCommand((ActionMessage *)local_e8);
              iVar6 = 0;
              if (bVar4) goto LAB_002d6594;
              local_320._M_allocated_capacity = (size_type)&local_310;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_320,"unknown route and no broker, dropping message ","");
              prettyPrintString_abi_cxx11_(&local_300,(helics *)local_e8,command);
              uVar13 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_allocated_capacity != &local_310) {
                uVar13 = local_310._M_allocated_capacity;
              }
              pvVar20 = (void *)local_320._8_8_;
              if ((ulong)uVar13 < local_300._M_string_length + local_320._8_8_) {
                uVar13 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_300._M_dataplus._M_p != &local_300.field_2) {
                  uVar13 = local_300.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar13 < local_300._M_string_length + local_320._8_8_) goto LAB_002d686c;
                pbVar7 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_300,0,0,(char *)local_320._M_allocated_capacity,
                                    local_320._8_8_);
              }
              else {
LAB_002d686c:
                pbVar7 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_320,local_300._M_dataplus._M_p,
                                   local_300._M_string_length);
              }
              local_298 = (undefined1  [8])(local_290 + 8);
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar7->_M_dataplus)._M_p;
              paVar10 = &pbVar7->field_2;
              if (paVar18 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)paVar10) {
                local_290._8_8_ = paVar10->_M_allocated_capacity;
                local_290._16_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              }
              else {
                local_290._8_8_ = paVar10->_M_allocated_capacity;
                local_298 = (undefined1  [8])paVar18;
              }
              cVar14._M_node = (_Base_ptr)pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
              pbVar7->_M_string_length = 0;
              paVar10->_M_local_buf[0] = '\0';
              message_00._M_str = (char *)local_298;
              message_00._M_len = (size_t)cVar14._M_node;
              local_290._0_8_ = cVar14._M_node;
              CommsInterface::logWarning((CommsInterface *)this,message_00);
              if (local_298 != (undefined1  [8])(local_290 + 8)) {
                cVar14._M_node = (_Base_ptr)(local_290._8_8_ + 1);
                operator_delete((void *)local_298,(ulong)cVar14._M_node);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300._M_dataplus._M_p != &local_300.field_2) {
                cVar14._M_node = (_Base_ptr)(local_300.field_2._M_allocated_capacity + 1);
                operator_delete(local_300._M_dataplus._M_p,(ulong)cVar14._M_node);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_allocated_capacity != &local_310) {
                cVar14._M_node = (_Base_ptr)(local_310._M_allocated_capacity + 1);
                operator_delete((void *)local_320._M_allocated_capacity,(ulong)cVar14._M_node);
              }
              goto LAB_002d6594;
            }
          }
          else {
            psVar19 = (socket_t *)(paVar18->_M_local_buf + 0x28);
          }
          iVar6 = 0;
          cVar14._M_node =
               (_Base_ptr)
               local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
          zmq::detail::socket_base::send
                    (&psVar19->super_socket_base,iVar5,
                     local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish +
                     -(long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,0,__flags);
        }
      }
LAB_002d6594:
      ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      iVar5 = (int)cVar14._M_node;
    } while (iVar6 != 3);
    zmq::socket_t::close(&local_2e0,iVar5);
    std::
    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
    ::clear((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
             *)local_168);
    if ((this->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED) {
      local_298 = (undefined1  [8])(local_290 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"close","");
      auVar15 = local_298;
      iVar6 = zmq_send(local_2c8.super_socket_base._handle,local_298,local_290._0_8_,1);
      iVar5 = SUB84(auVar15,0);
      if ((iVar6 < 0) && (iVar6 = zmq_errno(), iVar6 != 0xb)) {
        this_00 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(this_00);
        __cxa_throw(this_00,&zmq::error_t::typeinfo,std::exception::~exception);
      }
      if (local_298 != (undefined1  [8])(local_290 + 8)) {
        uVar16 = local_290._8_8_ + 1;
        operator_delete((void *)local_298,uVar16);
        iVar5 = (int)uVar16;
      }
    }
    zmq::socket_t::close(&local_2c8,iVar5);
    status = TERMINATED;
    CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
    zmq_msg_close(local_128);
    std::
    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
    ::~_Rb_tree((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_zmq::socket_t>,_std::_Select1st<std::pair<const_helics::route_id,_zmq::socket_t>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                 *)local_168);
    psVar19 = &local_2e0;
  }
  zmq::socket_t::close(psVar19,status);
  if ((unique_ptr<zmq::context_t,_std::default_delete<zmq::context_t>_> *)
      local_1d8[0].name.field_2._0_8_ != &local_1d8[0].zcontext) {
    puVar17 = (undefined1 *)
              ((long)(void **)local_1d8[0].zcontext._M_t.
                              super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>
                              .super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl + 1);
    operator_delete((void *)local_1d8[0].name.field_2._0_8_,(ulong)puVar17);
    status = (ConnectionStatus)puVar17;
  }
  zmq::socket_t::close(&local_2c8,status);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8[0].name._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8[0].name._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ZmqComms::queue_tx_function()
{
    std::vector<char> buffer;
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    auto ctx = ZmqContextManager::getContextPointer();
    // Setup the control socket for comms with the receiver
    zmq::socket_t controlSocket(ctx->getBaseContext(), ZMQ_PAIR);
    controlSocket.setsockopt(ZMQ_LINGER, 200);
    std::string controlsockString =
        std::string("inproc://") + name + '_' + getRandomID() + "_control";
    controlSocket.connect(controlsockString);
    try {
        auto res = initializeBrokerConnections(controlSocket);
        if (res < 0) {
            setTxStatus((res != -3) ? ConnectionStatus::ERRORED : ConnectionStatus::TERMINATED);

            controlSocket.close();
            return;
        }
    }
    catch (const zmq::error_t&) {
        controlSocket.close();
        return;
    }

    zmq::socket_t brokerPushSocket(ctx->getBaseContext(), ZMQ_PUSH);
    brokerPushSocket.setsockopt(ZMQ_LINGER, 200);
    std::map<route_id, zmq::socket_t> routes;  // for all the other possible routes
    // ZmqRequestSets priority_routes;  //!< object to handle the management of the priority
    // routes

    if (hasBroker) {
        //   priority_routes.addRoutes (0, makePortAddress (brokerTargetAddress, brokerPort+1));
        brokerPushSocket.connect(makePortAddress(brokerTargetAddress, brokerPort));
    }
    setTxStatus(ConnectionStatus::CONNECTED);
    zmq::message_t msg;
    bool continueProcessing{true};
    while (continueProcessing) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (control_route == rid) {
                switch (cmd.messageID) {
                    case RECONNECT_TRANSMITTER:
                        setTxStatus(ConnectionStatus::CONNECTED);
                        break;
                    case NEW_BROKER_INFORMATION:
                        brokerPushSocket.close();
                        brokerPushSocket = zmq::socket_t(ctx->getBaseContext(), ZMQ_PUSH);
                        brokerPushSocket.setsockopt(ZMQ_LINGER, 200);
                        brokerTargetAddress = cmd.payload.to_string();
                        brokerPort = cmd.getExtraData();
                        brokerPushSocket.connect(makePortAddress(brokerTargetAddress, brokerPort));
                        break;
                    case NEW_ROUTE: {
                        try {
                            auto interfaceAndPort = gmlc::networking::extractInterfaceAndPort(
                                std::string(cmd.payload.to_string()));

                            auto zsock = zmq::socket_t(ctx->getBaseContext(), ZMQ_PUSH);
                            zsock.setsockopt(ZMQ_LINGER, 100);
                            zsock.connect(
                                makePortAddress(interfaceAndPort.first, interfaceAndPort.second));
                            routes.emplace(route_id{cmd.getExtraData()}, std::move(zsock));
                        }
                        catch (const zmq::error_t& e) {
                            // TODO(PT): do something???
                            logError(std::string("unable to connect route") +
                                     std::string(cmd.payload.to_string()) + "::" + e.what());
                        }
                        processed = true;
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case DISCONNECT:
                        continueProcessing = false;
                        processed = true;
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }
        if (getRouteTypeCode(rid) == json_route_code || useJsonSerialization) {
            auto str = cmd.to_json_string();
            buffer.resize(str.size());
            std::copy(str.begin(), str.end(), buffer.begin());

        } else {
            cmd.to_vector(buffer);
        }
        if (rid == parent_route_id) {
            if (hasBroker) {
                brokerPushSocket.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                      zmq::send_flags::none);
            } else {
                logWarning("no route to broker for message");
            }
        } else if (rid == control_route) {  // send to rx thread loop
            try {
                controlSocket.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                   zmq::send_flags::dontwait);
            }
            catch (const zmq::error_t& e) {
                if ((getRxStatus() == ConnectionStatus::TERMINATED) ||
                    (getRxStatus() == ConnectionStatus::ERRORED)) {
                    break;
                }
                logError(e.what());
            }
            continue;
        } else {
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                rt_find->second.send(zmq::const_buffer(buffer.data(), buffer.size()));
            } else {
                if (hasBroker) {
                    brokerPushSocket.send(zmq::const_buffer(buffer.data(), buffer.size()));
                } else {
                    if (!isIgnoreableCommand(cmd)) {
                        logWarning(std::string("unknown route and no broker, dropping message ") +
                                   prettyPrintString(cmd));
                    }
                }
            }
        }
    }
    brokerPushSocket.close();

    routes.clear();
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        try {
            controlSocket.send(std::string("close"), zmq::send_flags::dontwait);
        }
        catch (const zmq::error_t&) {
            // this probably just means it got closed simultaneously which would be unusual but
            // not impossible
        }
    }

    controlSocket.close();

    setTxStatus(ConnectionStatus::TERMINATED);
}